

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noise_model.c
# Opt level: O2

int aom_flat_block_finder_init
              (aom_flat_block_finder_t *block_finder,int block_size,int bit_depth,int use_highbd)

{
  double dVar1;
  ulong uVar2;
  int iVar3;
  double *memblk;
  double *pdVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double *pdVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  aom_equation_system_t eqns;
  double coords [3];
  
  uVar2 = (ulong)(uint)block_size;
  block_finder->AtA_inv = (double *)0x0;
  block_finder->A = (double *)0x0;
  iVar3 = equation_system_init(&eqns,3);
  if (iVar3 == 0) {
    iVar3 = 0;
    fprintf(_stderr,"Failed to init equation system for block_size=%d\n",uVar2);
  }
  else {
    memblk = (double *)aom_malloc(0x48);
    pdVar4 = (double *)aom_malloc((ulong)(uint)(block_size * block_size * 3) << 3);
    if ((memblk == (double *)0x0) || (pdVar4 == (double *)0x0)) {
      iVar3 = 0;
      fprintf(_stderr,"Failed to alloc A or AtA_inv for block_size=%d\n",uVar2);
      aom_free(memblk);
      aom_free(pdVar4);
      equation_system_free(&eqns);
    }
    else {
      block_finder->A = pdVar4;
      block_finder->AtA_inv = memblk;
      block_finder->block_size = block_size;
      block_finder->normalization = (double)~(-1 << ((byte)bit_depth & 0x1f));
      block_finder->use_highbd = use_highbd;
      dVar11 = (double)block_size * 0.5;
      uVar5 = 0;
      uVar6 = 0;
      if (0 < block_size) {
        uVar6 = uVar2;
      }
      for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
        dVar12 = ((double)(int)uVar5 - dVar11) / dVar11;
        for (uVar7 = 0; uVar7 != uVar2; uVar7 = uVar7 + 1) {
          coords[1] = ((double)(int)uVar7 - dVar11) / dVar11;
          coords[0] = dVar12;
          coords[2] = 1.0;
          lVar9 = uVar7 + uVar5 * (long)block_size;
          pdVar4[lVar9 * 3] = dVar12;
          pdVar4[lVar9 * 3 + 1] = coords[1];
          pdVar4[lVar9 * 3 + 2] = 1.0;
          pdVar8 = eqns.A;
          for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
            dVar1 = coords[lVar9];
            for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
              pdVar8[lVar10] = coords[lVar10] * dVar1 + pdVar8[lVar10];
            }
            pdVar8 = pdVar8 + 3;
          }
        }
      }
      for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
        *eqns.b = 0.0;
        eqns.b[1] = 0.0;
        eqns.b[2] = 0.0;
        eqns.b[lVar9] = 1.0;
        equation_system_solve(&eqns);
        pdVar4 = memblk;
        for (lVar10 = 0; lVar10 != 3; lVar10 = lVar10 + 1) {
          *pdVar4 = eqns.x[lVar10];
          pdVar4 = pdVar4 + 3;
        }
        memblk = memblk + 1;
      }
      equation_system_free(&eqns);
      iVar3 = 1;
    }
  }
  return iVar3;
}

Assistant:

int aom_flat_block_finder_init(aom_flat_block_finder_t *block_finder,
                               int block_size, int bit_depth, int use_highbd) {
  const int n = block_size * block_size;
  aom_equation_system_t eqns;
  double *AtA_inv = 0;
  double *A = 0;
  int x = 0, y = 0, i = 0, j = 0;
  block_finder->A = NULL;
  block_finder->AtA_inv = NULL;

  if (!equation_system_init(&eqns, kLowPolyNumParams)) {
    fprintf(stderr, "Failed to init equation system for block_size=%d\n",
            block_size);
    return 0;
  }

  AtA_inv = (double *)aom_malloc(kLowPolyNumParams * kLowPolyNumParams *
                                 sizeof(*AtA_inv));
  A = (double *)aom_malloc(kLowPolyNumParams * n * sizeof(*A));
  if (AtA_inv == NULL || A == NULL) {
    fprintf(stderr, "Failed to alloc A or AtA_inv for block_size=%d\n",
            block_size);
    aom_free(AtA_inv);
    aom_free(A);
    equation_system_free(&eqns);
    return 0;
  }

  block_finder->A = A;
  block_finder->AtA_inv = AtA_inv;
  block_finder->block_size = block_size;
  block_finder->normalization = (1 << bit_depth) - 1;
  block_finder->use_highbd = use_highbd;

  for (y = 0; y < block_size; ++y) {
    const double yd = ((double)y - block_size / 2.) / (block_size / 2.);
    for (x = 0; x < block_size; ++x) {
      const double xd = ((double)x - block_size / 2.) / (block_size / 2.);
      const double coords[3] = { yd, xd, 1 };
      const int row = y * block_size + x;
      A[kLowPolyNumParams * row + 0] = yd;
      A[kLowPolyNumParams * row + 1] = xd;
      A[kLowPolyNumParams * row + 2] = 1;

      for (i = 0; i < kLowPolyNumParams; ++i) {
        for (j = 0; j < kLowPolyNumParams; ++j) {
          eqns.A[kLowPolyNumParams * i + j] += coords[i] * coords[j];
        }
      }
    }
  }

  // Lazy inverse using existing equation solver.
  for (i = 0; i < kLowPolyNumParams; ++i) {
    memset(eqns.b, 0, sizeof(*eqns.b) * kLowPolyNumParams);
    eqns.b[i] = 1;
    equation_system_solve(&eqns);

    for (j = 0; j < kLowPolyNumParams; ++j) {
      AtA_inv[j * kLowPolyNumParams + i] = eqns.x[j];
    }
  }
  equation_system_free(&eqns);
  return 1;
}